

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_frozen_serialize(roaring_bitmap_t *rb,char *buf)

{
  char *__dest;
  uint8_t uVar1;
  bitset_container_t *bitset;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *__dest_00;
  char *res_1;
  char *__dest_01;
  ulong uVar8;
  long lVar9;
  long lVar10;
  array_container_t *ac;
  char *__dest_02;
  long lVar11;
  char *res_2;
  char *res_3;
  
  uVar3 = (rb->high_low_container).size;
  lVar5 = (long)(int)uVar3;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  lVar6 = 0;
  lVar10 = 0;
  lVar9 = 0;
  for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    uVar1 = (rb->high_low_container).typecodes[uVar7];
    if (uVar1 == '\x03') {
      lVar10 = lVar10 + (long)*(rb->high_low_container).containers[uVar7] * 4;
    }
    else if (uVar1 == '\x02') {
      lVar6 = lVar6 + (long)*(rb->high_low_container).containers[uVar7] * 2;
    }
    else {
      lVar9 = lVar9 + 0x2000;
    }
  }
  __dest_01 = buf + lVar9;
  __dest_00 = __dest_01 + lVar10;
  __dest = __dest_00 + lVar6;
  iVar2 = uVar3 * 2;
  __dest_02 = buf;
  for (lVar11 = 0; lVar11 < (int)uVar3; lVar11 = lVar11 + 1) {
    uVar1 = (rb->high_low_container).typecodes[lVar11];
    bitset = (bitset_container_t *)(rb->high_low_container).containers[lVar11];
    if (uVar1 == '\x03') {
      memcpy(__dest_01,bitset->words,(long)bitset->cardinality << 2);
      uVar7 = (ulong)bitset->cardinality;
      __dest_01 = __dest_01 + uVar7 * 4;
    }
    else {
      if (uVar1 == '\x02') {
        memcpy(__dest_00,bitset->words,(long)bitset->cardinality * 2);
        iVar4 = bitset->cardinality;
        __dest_00 = __dest_00 + (long)iVar4 * 2;
      }
      else {
        memcpy(__dest_02,bitset->words,0x2000);
        iVar4 = bitset->cardinality;
        if (iVar4 == -1) {
          iVar4 = bitset_container_compute_cardinality(bitset);
        }
        __dest_02 = __dest_02 + 0x2000;
      }
      uVar7 = (ulong)(iVar4 - 1);
    }
    *(short *)(buf + lVar11 * 2 + (long)iVar2 + lVar10 + lVar9 + lVar6) = (short)uVar7;
    uVar3 = (rb->high_low_container).size;
  }
  memcpy(__dest,(rb->high_low_container).keys,(long)(int)uVar3 * 2);
  memcpy(__dest + (long)iVar2 * 2,(rb->high_low_container).typecodes,
         (long)(rb->high_low_container).size);
  *(uint *)(__dest + (long)iVar2 * 2 + lVar5) = (rb->high_low_container).size << 0xf | 0x35c6;
  return;
}

Assistant:

void roaring_bitmap_frozen_serialize(const roaring_bitmap_t *rb, char *buf) {
    /*
     * Note: we do not require user to supply a specifically aligned buffer.
     * Thus we have to use memcpy() everywhere.
     */

    const roaring_array_t *ra = &rb->high_low_container;

    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_zone_size +=
                    BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                run_zone_size += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                array_zone_size += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }

    uint64_t *bitset_zone = (uint64_t *)arena_alloc(&buf, bitset_zone_size);
    rle16_t *run_zone = (rle16_t *)arena_alloc(&buf, run_zone_size);
    uint16_t *array_zone = (uint16_t *)arena_alloc(&buf, array_zone_size);
    uint16_t *key_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint16_t *count_zone = (uint16_t *)arena_alloc(&buf, 2 * ra->size);
    uint8_t *typecode_zone = (uint8_t *)arena_alloc(&buf, ra->size);
    uint32_t *header_zone = (uint32_t *)arena_alloc(&buf, 4);

    for (int32_t i = 0; i < ra->size; i++) {
        uint16_t count;
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                const bitset_container_t *bc =
                    const_CAST_bitset(ra->containers[i]);
                memcpy(bitset_zone, bc->words,
                       BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t));
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                if (bc->cardinality != BITSET_UNKNOWN_CARDINALITY) {
                    count = (uint16_t)(bc->cardinality - 1);
                } else {
                    count =
                        (uint16_t)(bitset_container_compute_cardinality(bc) -
                                   1);
                }
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                size_t num_bytes = rc->n_runs * sizeof(rle16_t);
                memcpy(run_zone, rc->runs, num_bytes);
                run_zone += rc->n_runs;
                count = (uint16_t)rc->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                size_t num_bytes = ac->cardinality * sizeof(uint16_t);
                memcpy(array_zone, ac->array, num_bytes);
                array_zone += ac->cardinality;
                count = (uint16_t)(ac->cardinality - 1);
                break;
            }
            default:
                roaring_unreachable;
        }
        memcpy(&count_zone[i], &count, 2);
    }
    memcpy(key_zone, ra->keys, ra->size * sizeof(uint16_t));
    memcpy(typecode_zone, ra->typecodes, ra->size * sizeof(uint8_t));
    uint32_t header = ((uint32_t)ra->size << 15) | FROZEN_COOKIE;
    memcpy(header_zone, &header, 4);
}